

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O0

FuncVec * __thiscall dg::llvmdg::DGCallGraphImpl::callees(DGCallGraphImpl *this,Function *F)

{
  bool bVar1;
  reference ppFVar2;
  PSNode **in_RSI;
  PSNode *in_RDI;
  FuncNode *nd;
  const_iterator __end2;
  const_iterator __begin2;
  vector<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*>_>
  *__range2;
  FuncNode *fnd;
  iterator it;
  FuncVec *ret;
  map<const_llvm::Function_*,_dg::pta::PSNode_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::pta::PSNode_*>_>_>
  *in_stack_ffffffffffffff78;
  vector<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*>_>
  *this_00;
  PSNode *n;
  GenericCallGraph<dg::pta::PSNode_*> *in_stack_ffffffffffffff98;
  __normal_iterator<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*const_*,_std::vector<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*>_>_>
  local_50;
  vector<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*>_>
  *local_48;
  FuncNode *local_40;
  _Self local_30;
  _Self local_28;
  undefined1 local_19;
  
  local_19 = 0;
  n = in_RDI;
  std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::vector
            ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)0x19144a);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<const_llvm::Function_*,_dg::pta::PSNode_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::pta::PSNode_*>_>_>
       ::find(in_stack_ffffffffffffff78,(key_type *)0x19145d);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<const_llvm::Function_*,_dg::pta::PSNode_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::pta::PSNode_*>_>_>
       ::end(in_stack_ffffffffffffff78);
  bVar1 = std::operator==(&local_28,&local_30);
  if (!bVar1) {
    this_00 = (vector<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*>_>
               *)in_RSI[1];
    std::_Rb_tree_iterator<std::pair<const_llvm::Function_*const,_dg::pta::PSNode_*>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_llvm::Function_*const,_dg::pta::PSNode_*>_> *)
               0x1914b3);
    local_40 = GenericCallGraph<dg::pta::PSNode_*>::get(in_stack_ffffffffffffff98,in_RSI);
    local_48 = GenericCallGraph<dg::pta::PSNode_*>::FuncNode::getCalls((FuncNode *)local_40);
    local_50._M_current =
         (FuncNode **)
         std::
         vector<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*>_>
         ::begin(this_00);
    std::
    vector<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*>_>
    ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*const_*,_std::vector<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*>_>_>
                               *)n,(__normal_iterator<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*const_*,_std::vector<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*>_>_>
                                    *)this_00), bVar1) {
      ppFVar2 = __gnu_cxx::
                __normal_iterator<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*const_*,_std::vector<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*>_>_>
                ::operator*(&local_50);
      GenericCallGraph<dg::pta::PSNode_*>::FuncNode::getValue(*ppFVar2);
      getFunFromNode(n);
      std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::push_back
                ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)n,
                 (value_type *)this_00);
      __gnu_cxx::
      __normal_iterator<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*const_*,_std::vector<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<dg::pta::PSNode_*>::FuncNode_*>_>_>
      ::operator++(&local_50);
    }
  }
  return (FuncVec *)in_RDI;
}

Assistant:

FuncVec callees(const llvm::Function *F) override {
        FuncVec ret;
        auto it = _mapping.find(F);
        if (it == _mapping.end())
            return ret;
        const auto *fnd = _cg.get(it->second);
        for (auto *nd : fnd->getCalls()) {
            ret.push_back(getFunFromNode(nd->getValue()));
        }
        return ret;
    }